

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O0

LispPTR CIntToLispInt(int cint)

{
  int iVar1;
  int *NAddr;
  LispPTR *wordp;
  int cint_local;
  
  iVar1 = cint;
  if (cint < 1) {
    iVar1 = -cint;
  }
  if (iVar1 < 0x10000) {
    if (cint < 0) {
      wordp._4_4_ = cint & 0xffffU | 0xf0000;
    }
    else {
      wordp._4_4_ = cint | 0xe0000;
    }
  }
  else {
    NAddr = (int *)createcell68k(2);
    *NAddr = cint;
    wordp._4_4_ = LAddrFromNative(NAddr);
  }
  return wordp._4_4_;
}

Assistant:

LispPTR CIntToLispInt(int cint) {
  if (abs(cint) > 0xFFFF) { /* its a fixp! */
    LispPTR *wordp;
    wordp = (LispPTR *)createcell68k(TYPE_FIXP);
    *((int *)wordp) = cint;
    return (LAddrFromNative(wordp));
  } else if (cint >= 0) { /* its a positive smallp! */
    return (S_POSITIVE | cint);
  } else { /* its a negative smallp! */
    return (S_NEGATIVE | (0xFFFF & cint));
  }
}